

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_InitEffects(void)

{
  DWORD DVar1;
  uint32 uVar2;
  BYTE *pBVar3;
  int *piVar4;
  
  P_InitParticles();
  piVar4 = &grey1;
  pBVar3 = &Colors[0].r;
  do {
    uVar2 = ParticleColor((uint)pBVar3[1] << 8 | (uint)*pBVar3 << 0x10 | (uint)pBVar3[2]);
    *piVar4 = uVar2;
    DVar1 = gameinfo.defaultbloodparticlecolor;
    piVar4 = *(int **)(pBVar3 + 8);
    pBVar3 = pBVar3 + 0x10;
  } while ((uint32 *)piVar4 != (uint32 *)0x0);
  blood1 = ParticleColor(gameinfo.defaultbloodparticlecolor);
  blood2 = ParticleColor((DVar1 >> 8 & 0xff) / 3 << 8 | (DVar1 >> 0x10 & 0xff) / 3 << 0x10 |
                         (DVar1 & 0xff) / 3);
  return;
}

Assistant:

void P_InitEffects ()
{
	const struct ColorList *color = Colors;

	P_InitParticles();
	while (color->color)
	{
		*(color->color) = ParticleColor(color->r, color->g, color->b);
		color++;
	}

	int kind = gameinfo.defaultbloodparticlecolor;
	blood1 = ParticleColor(kind);
	blood2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
}